

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

void blowfish_ssh_setkey(ssh_cipher *cipher,void *key)

{
  int iVar1;
  
  iVar1 = cipher->vt->padded_keybytes;
  blowfish_initkey((BlowfishContext *)(cipher + -0x20a));
  blowfish_expandkey((BlowfishContext *)(cipher + -0x20a),key,(short)iVar1,(void *)0x0,0);
  return;
}

Assistant:

static void blowfish_ssh_setkey(ssh_cipher *cipher, const void *key)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_setkey(&ctx->context, key, ctx->ciph.vt->padded_keybytes);
}